

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDBTest.cpp
# Opt level: O1

void __thiscall
SQLiteBuildDBTest_CloseDBConnectionAfterCloseCall_Test::
~SQLiteBuildDBTest_CloseDBConnectionAfterCloseCall_Test
          (SQLiteBuildDBTest_CloseDBConnectionAfterCloseCall_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SQLiteBuildDBTest, CloseDBConnectionAfterCloseCall) {
  // Create a temporary file.
  llvm::SmallString<256> dbPath;
  auto ec = llvm::sys::fs::createTemporaryFile("build", "db", dbPath);
  EXPECT_EQ(bool(ec), false);
  const char* path = dbPath.c_str();
  fprintf(stderr, "using db: %s\n", path);
  
  std::string error;
  std::unique_ptr<BuildDB> buildDB = createSQLiteBuildDB(dbPath, 1, /* recreateUnmatchedVersion = */ true, &error);
  EXPECT_TRUE(buildDB != nullptr);
  EXPECT_EQ(error, "");
  
  buildDB->buildStarted(&error);
  EXPECT_EQ(error, "");
  
  buildDB->buildComplete();
}